

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O1

Optional<Corrade::Containers::StridedArrayView<1U,_const_unsigned_int>_> * __thiscall
Corrade::Utility::Json::parseUnsignedIntArray
          (Optional<Corrade::Containers::StridedArrayView<1U,_const_unsigned_int>_>
           *__return_storage_ptr__,Json *this,JsonToken *token,size_t expectedSize)

{
  ulong uVar1;
  unsigned_long value;
  size_t value_00;
  bool bVar2;
  State *pSVar3;
  Debug *pDVar4;
  ostream *output;
  JsonToken *pJVar5;
  long lVar6;
  StringView SVar7;
  Error err;
  Error local_60;
  size_t local_38;
  
  pSVar3 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
  pJVar5 = (pSVar3->tokens)._data;
  pSVar3 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
  if ((pSVar3->tokens)._size <= (ulong)(((long)token - (long)pJVar5 >> 3) * -0x5555555555555555)) {
    output = Error::defaultOutput();
    Error::Error(&local_60,output,(Flags)0x0);
    Debug::operator<<(&local_60.super_Debug,
                      "Utility::Json::parseUnsignedIntArray(): token not owned by the instance");
    Error::~Error(&local_60);
    abort();
  }
  uVar1 = token->_sizeFlagsParsedTypeType;
  if ((uint)(uVar1 >> 0x3d) == 2) {
    if ((uVar1 & 0x1c00000000000000) == 0) {
      token->_sizeFlagsParsedTypeType = uVar1 | 0x1c00000000000000;
    }
    value = (token->field_2)._childCount;
    local_38 = expectedSize;
    if (value != 0) {
      lVar6 = value * 0x18;
      pJVar5 = token + 1;
      do {
        if ((pJVar5->_sizeFlagsParsedTypeType & 0xe000000000000000) != 0xa000000000000000) {
          Error::Error(&local_60,(Flags)0x0);
          pDVar4 = Debug::operator<<(&local_60.super_Debug,
                                     "Utility::Json::parseUnsignedIntArray(): expected a number, got"
                                    );
          pDVar4 = Utility::operator<<(pDVar4,pJVar5->_sizeFlagsParsedTypeType & (String|Object));
          Debug::operator<<(pDVar4,"at");
          pSVar3 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
          if (pJVar5->_data == (char *)0x0) {
            SVar7 = (StringView)(ZEXT816(0x8000000000000000) << 0x40);
          }
          else {
            SVar7 = Containers::BasicStringView<const_char>::slice
                              (&pSVar3->string,(pSVar3->string)._data,pJVar5->_data);
          }
          printFilePosition(this,&local_60.super_Debug,SVar7);
          goto LAB_0013561c;
        }
        bVar2 = parseUnsignedIntInternal(this,"Utility::Json::parseUnsignedIntArray():",pJVar5);
        if (!bVar2) {
          __return_storage_ptr__->_set = false;
          return __return_storage_ptr__;
        }
        pJVar5 = pJVar5 + 1;
        lVar6 = lVar6 + -0x18;
      } while (lVar6 != 0);
    }
    value_00 = local_38;
    if (value == local_38 || local_38 == 0) {
      __return_storage_ptr__->_set = true;
      (__return_storage_ptr__->field_0)._value._data = &token[1].field_2;
      *(unsigned_long *)((long)&__return_storage_ptr__->field_0 + 8) = value;
      (__return_storage_ptr__->field_0)._value._stride._data[0] = 0x18;
      return __return_storage_ptr__;
    }
    Error::Error(&local_60,(Flags)0x0);
    pDVar4 = Debug::operator<<(&local_60.super_Debug,
                               "Utility::Json::parseUnsignedIntArray(): expected a");
    pDVar4 = Debug::operator<<(pDVar4,value_00);
    (pDVar4->_immediateFlags)._value = (pDVar4->_immediateFlags)._value | 4;
    pDVar4 = Debug::operator<<(pDVar4,"-element array, got");
    pDVar4 = Debug::operator<<(pDVar4,value);
    Debug::operator<<(pDVar4,"at");
    pSVar3 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
    if (token->_data == (char *)0x0) {
      SVar7 = (StringView)(ZEXT816(0x8000000000000000) << 0x40);
    }
    else {
      SVar7 = Containers::BasicStringView<const_char>::slice
                        (&pSVar3->string,(pSVar3->string)._data,token->_data);
    }
    printFilePosition(this,&local_60.super_Debug,SVar7);
  }
  else {
    Error::Error(&local_60,(Flags)0x0);
    pDVar4 = Debug::operator<<(&local_60.super_Debug,
                               "Utility::Json::parseUnsignedIntArray(): expected an array, got");
    pDVar4 = Utility::operator<<(pDVar4,token->_sizeFlagsParsedTypeType & (String|Object));
    Debug::operator<<(pDVar4,"at");
    pSVar3 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
    if (token->_data == (char *)0x0) {
      SVar7 = (StringView)(ZEXT816(0x8000000000000000) << 0x40);
    }
    else {
      SVar7 = Containers::BasicStringView<const_char>::slice
                        (&pSVar3->string,(pSVar3->string)._data,token->_data);
    }
    printFilePosition(this,&local_60.super_Debug,SVar7);
  }
LAB_0013561c:
  __return_storage_ptr__->_set = false;
  Error::~Error(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Containers::Optional<Containers::StridedArrayView1D<const std::uint32_t>> Json::parseUnsignedIntArray(const JsonToken& token, const std::size_t expectedSize) {
    CORRADE_ASSERT(std::size_t(&token - _state->tokens) < _state->tokens.size(),
        "Utility::Json::parseUnsignedIntArray(): token not owned by the instance", {});

    if(token.type() != JsonToken::Type::Array) {
        Error err;
        err << "Utility::Json::parseUnsignedIntArray(): expected an array, got" << token.type() << "at";
        printFilePosition(err, _state->string.prefix(token._data));
        return {};
    }

    parseObjectArrayInternal(const_cast<JsonToken&>(token));
    const std::size_t size =
        #ifndef CORRADE_TARGET_32BIT
        token._childCount
        #else
        token._childCountFlagsTypeNan & JsonToken::ChildCountMask
        #endif
        ;
    /* As this is expected to be a value array, we go by simple incrementing
       instead of with i->next(). If a nested object or array would be
       encountered, the type() check fails. */
    for(const JsonToken *i = &token + 1, *end = &token + 1 + size; i != end; ++i) {
        if(i->type() != JsonToken::Type::Number) {
            Error err;
            err << "Utility::Json::parseUnsignedIntArray(): expected a number, got" << i->type() << "at";
            printFilePosition(err, _state->string.prefix(i->_data));
            return {};
        }

        if(!parseUnsignedIntInternal("Utility::Json::parseUnsignedIntArray():", const_cast<JsonToken&>(*i)))
            return {};
    }

    /* Needs to be after the type-checking loop, otherwise the child count may
       include also nested tokens and the message would be confusing */
    if(expectedSize && size != expectedSize) {
        Error err;
        err << "Utility::Json::parseUnsignedIntArray(): expected a" << expectedSize << Debug::nospace << "-element array, got" << size << "at";
        printFilePosition(err, _state->string.prefix(token._data));
        return {};
    }

    return Containers::stridedArrayView(&token + 1, size).slice(&JsonToken::_parsedUnsignedInt);
}